

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

bool __thiscall MP1Node::recvCallBack(MP1Node *this,void *env,char *data,int size)

{
  bool bVar1;
  
  if (size < 4) {
    Log::LOG(this->log,&this->memberNode->addr,
             "Message received with size less than MessageHdr. Ignored.");
  }
  else {
    switch(*(undefined4 *)data) {
    case 0:
      bVar1 = joinReqHandler(this,env,data + 4,size + -4);
      return bVar1;
    case 1:
      bVar1 = joinRepHandler(this,env,data + 4,size + -4);
      return bVar1;
    case 2:
      bVar1 = heartbeatReqHandler(this,env,data + 4,size + -4);
      return bVar1;
    case 3:
      bVar1 = heartbeatRepHandler(this,env,data + 4,size + -4);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool MP1Node::recvCallBack(void *env, char *data, int size ) {
    /*
     * Your code goes here
     */
    if (size < (int)sizeof(MessageHdr)) {
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Message received with size less than MessageHdr. Ignored.");
#endif
        return false;
    }

    MessageHdr* messageHdr = (MessageHdr*) data;
    MsgTypes msgType = messageHdr->msgType;

    if (msgType == JOINREQ) {
        return joinReqHandler(env, data+sizeof(MessageHdr), size - sizeof(MessageHdr)); //no need for the msgType anymore, so move address right
    } else if (msgType == JOINREP) {
        return joinRepHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr)); //no need for the msgType anymore, so move address right
    } else if (msgType == HEARTBEATREQ) {
        return heartbeatReqHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr));
    } else if (msgType == HEARTBEATREP){
        return heartbeatRepHandler(env, data + sizeof(MessageHdr), size - sizeof(MessageHdr));
    } else {
        return false;
    }
}